

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O2

void printAdrLabelOperand(MCInst *MI,uint OpNum,SStream *O,uint scale)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  byte bVar3;
  uint uVar4;
  MCOperand *op;
  int64_t iVar5;
  undefined4 in_register_00000034;
  char *fmt;
  uint uVar6;
  
  op = MCInst_getOperand(MI,1);
  iVar5 = MCOperand_getImm(op);
  bVar3 = (byte)O & 0x1f;
  uVar6 = (int)iVar5 << bVar3;
  if ((int)iVar5 << bVar3 < 0) {
    fmt = "#-0x%x";
    uVar4 = -uVar6;
  }
  else {
    uVar4 = uVar6;
    if (uVar6 < 10) {
      fmt = "#%u";
    }
    else {
      fmt = "#0x%x";
    }
  }
  SStream_concat((SStream *)CONCAT44(in_register_00000034,OpNum),fmt,(ulong)uVar4);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).arm.op_count * 0x28 + 0x42;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).arm.op_count * 0x28 + 0x46) = uVar6;
    puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printAdrLabelOperand(MCInst *MI, unsigned OpNum, SStream *O, unsigned scale)
{
	MCOperand *MO = MCInst_getOperand(MI, OpNum);

	int32_t OffImm = (int32_t)MCOperand_getImm(MO) << scale;

	if (OffImm == INT32_MIN) {
		SStream_concat0(O, "#-0");
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_IMM;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].imm = 0;
			MI->flat_insn->detail->arm.op_count++;
		}
	} else {
		if (OffImm < 0)
			SStream_concat(O, "#-0x%x", -OffImm);
		else {
			if (OffImm > HEX_THRESHOLD)
				SStream_concat(O, "#0x%x", OffImm);
			else
				SStream_concat(O, "#%u", OffImm);
		}
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_IMM;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].imm = OffImm;
			MI->flat_insn->detail->arm.op_count++;
		}
	}
}